

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebase.h
# Opt level: O0

bool __thiscall ICM::TypeBase::DisperseType::operator==(DisperseType *this,DisperseType *lt)

{
  bool bVar1;
  DisperseType *lt_local;
  DisperseType *this_local;
  
  bVar1 = std::operator==(&this->data,&lt->data);
  return bVar1;
}

Assistant:

bool operator==(const DisperseType &lt) const {
				return this->data == lt.data;
			}